

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::Video::Video(Video *this,uint64_t id,Element *element,Document *doc,string *name)

{
  char *pcVar1;
  Element *el;
  Element *el_00;
  Element *el_01;
  Element *el_02;
  Token *pTVar2;
  size_t sVar3;
  uint8_t *puVar4;
  Token *t;
  Token *t_00;
  Token *t_01;
  uint32_t tokenIdx;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  allocator local_1f1;
  Scope *local_1f0;
  __shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2> local_1e8 [2];
  string *local_1c8;
  string *local_1c0;
  string *local_1b8;
  Document *local_1b0;
  string local_1a8 [11];
  
  local_1b0 = doc;
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Video_008681d8;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  (this->type)._M_string_length = 0;
  local_1b8 = (string *)&this->type;
  (this->type).field_2._M_local_buf[0] = '\0';
  (this->relativeFileName)._M_dataplus._M_p = (pointer)&(this->relativeFileName).field_2;
  (this->relativeFileName)._M_string_length = 0;
  local_1c8 = (string *)&this->relativeFileName;
  (this->relativeFileName).field_2._M_local_buf[0] = '\0';
  local_1c0 = (string *)&this->fileName;
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  (this->fileName)._M_string_length = 0;
  (this->fileName).field_2._M_local_buf[0] = '\0';
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->contentLength = 0;
  this->content = (uint8_t *)0x0;
  local_1f0 = GetRequiredScope(element);
  std::__cxx11::string::string((string *)local_1a8,"Type",(allocator *)local_1e8);
  el = Scope::operator[](local_1f0,local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::string((string *)local_1a8,"FileName",(allocator *)local_1e8);
  el_00 = Scope::FindElementCaseInsensitive(local_1f0,local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::string((string *)local_1a8,"RelativeFilename",(allocator *)local_1e8);
  el_01 = Scope::operator[](local_1f0,local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::string((string *)local_1a8,"Content",(allocator *)local_1e8);
  el_02 = Scope::operator[](local_1f0,local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  if (el != (Element *)0x0) {
    pTVar2 = GetRequiredToken(el,0);
    ParseTokenAsString_abi_cxx11_(local_1a8,(FBX *)pTVar2,t);
    std::__cxx11::string::operator=(local_1b8,(string *)local_1a8);
    std::__cxx11::string::~string((string *)local_1a8);
  }
  if (el_00 != (Element *)0x0) {
    pTVar2 = GetRequiredToken(el_00,0);
    ParseTokenAsString_abi_cxx11_(local_1a8,(FBX *)pTVar2,t_00);
    std::__cxx11::string::operator=(local_1c0,(string *)local_1a8);
    std::__cxx11::string::~string((string *)local_1a8);
  }
  if (el_01 != (Element *)0x0) {
    pTVar2 = GetRequiredToken(el_01,0);
    ParseTokenAsString_abi_cxx11_(local_1a8,(FBX *)pTVar2,t_01);
    std::__cxx11::string::operator=(local_1c8,(string *)local_1a8);
    std::__cxx11::string::~string((string *)local_1a8);
  }
  if ((el_02 != (Element *)0x0) &&
     ((el_02->tokens).
      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (el_02->tokens).
      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    pTVar2 = GetRequiredToken(el_02,0);
    pcVar1 = pTVar2->sbegin;
    if (pTVar2->column == 0xffffffff) {
      if ((ulong)((long)pTVar2->send - (long)pcVar1) < 5) {
        std::__cxx11::string::string
                  ((string *)local_1a8,
                   "binary data array is too short, need five (5) bytes for type signature and element count"
                   ,(allocator *)local_1e8);
        Util::DOMError(local_1a8,element);
      }
      if (*pcVar1 == 'R') {
        uVar6 = (ulong)*(uint *)(pcVar1 + 1);
        this->contentLength = uVar6;
        puVar4 = (uint8_t *)operator_new__(uVar6);
        this->content = puVar4;
        memcpy(puVar4,pcVar1 + 5,uVar6);
      }
      else {
        std::__cxx11::string::string
                  ((string *)local_1a8,"video content is not raw binary data, ignoring",
                   (allocator *)local_1e8);
        Util::DOMWarning(local_1a8,element);
        std::__cxx11::string::~string((string *)local_1a8);
      }
    }
    else {
      if (*pcVar1 != '\"') {
        std::__cxx11::string::string
                  ((string *)local_1a8,"embedded content is not surrounded by quotation marks",
                   (allocator *)local_1e8);
        Util::DOMError(local_1a8,element);
      }
      uVar8 = (long)(el_02->tokens).
                    super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(el_02->tokens).
                    super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
      uVar6 = 0;
      for (uVar5 = 0; uVar5 < uVar8; uVar5 = (ulong)((uint)uVar5 + 1)) {
        pTVar2 = GetRequiredToken(el_02,(uint)uVar5);
        sVar3 = Util::ComputeDecodedSizeBase64
                          (pTVar2->sbegin + 1,(size_t)(pTVar2->send + (-2 - (long)pTVar2->sbegin)));
        if (sVar3 == 0) {
          std::__cxx11::string::string
                    ((string *)local_1a8,"Corrupted embedded content found",(allocator *)local_1e8);
          Util::DOMError(local_1a8,element);
        }
        uVar6 = uVar6 + sVar3;
      }
      if (uVar6 == 0) {
        std::__cxx11::string::string
                  ((string *)local_1a8,"Corrupted embedded content found",(allocator *)local_1e8);
        Util::DOMError(local_1a8,element);
      }
      puVar4 = (uint8_t *)operator_new__(uVar6);
      this->content = puVar4;
      this->contentLength = uVar6;
      uVar7 = 0;
      for (uVar5 = 0; uVar5 < uVar8; uVar5 = (ulong)((uint)uVar5 + 1)) {
        pTVar2 = GetRequiredToken(el_02,(uint)uVar5);
        sVar3 = Util::DecodeBase64(pTVar2->sbegin + 1,
                                   (size_t)(pTVar2->send + (-2 - (long)pTVar2->sbegin)),
                                   this->content + uVar7,uVar6 - uVar7);
        uVar7 = uVar7 + sVar3;
      }
      if (uVar6 != uVar7) {
        if (this->content != (uint8_t *)0x0) {
          operator_delete__(this->content);
        }
        this->contentLength = 0;
        std::__cxx11::string::string
                  ((string *)local_1a8,"Corrupted embedded content found",(allocator *)local_1e8);
        Util::DOMError(local_1a8,element);
      }
    }
  }
  std::__cxx11::string::string((string *)local_1a8,"Video.FbxVideo",&local_1f1);
  Util::GetPropertyTable((Util *)local_1e8,local_1b0,local_1a8,element,local_1f0,false);
  std::__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->props).
              super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>,
             local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8[0]._M_refcount);
  std::__cxx11::string::~string((string *)local_1a8);
  return;
}

Assistant:

Video::Video(uint64_t id, const Element& element, const Document& doc, const std::string& name)
: Object(id,element,name)
, contentLength(0)
, content(0)
{
    const Scope& sc = GetRequiredScope(element);

    const Element* const Type = sc["Type"];
    const Element* const FileName = sc.FindElementCaseInsensitive("FileName");  //some files retain the information as "Filename", others "FileName", who knows
    const Element* const RelativeFilename = sc["RelativeFilename"];
    const Element* const Content = sc["Content"];

    if(Type) {
        type = ParseTokenAsString(GetRequiredToken(*Type,0));
    }

    if(FileName) {
        fileName = ParseTokenAsString(GetRequiredToken(*FileName,0));
    }

    if(RelativeFilename) {
        relativeFileName = ParseTokenAsString(GetRequiredToken(*RelativeFilename,0));
    }

    if(Content && !Content->Tokens().empty()) {
        //this field is omitted when the embedded texture is already loaded, let's ignore if it's not found
        try {
            const Token& token = GetRequiredToken(*Content, 0);
            const char* data = token.begin();
            if (!token.IsBinary()) {
                if (*data != '"') {
                    DOMError("embedded content is not surrounded by quotation marks", &element);
                }
                else {
                    size_t targetLength = 0;
                    auto numTokens = Content->Tokens().size();
                    // First time compute size (it could be large like 64Gb and it is good to allocate it once)
                    for (uint32_t tokenIdx = 0; tokenIdx < numTokens; ++tokenIdx)
                    {
                        const Token& dataToken = GetRequiredToken(*Content, tokenIdx);
                        size_t tokenLength = dataToken.end() - dataToken.begin() - 2; // ignore double quotes
                        const char* base64data = dataToken.begin() + 1;
                        const size_t outLength = Util::ComputeDecodedSizeBase64(base64data, tokenLength);
                        if (outLength == 0)
                        {
                            DOMError("Corrupted embedded content found", &element);
                        }
                        targetLength += outLength;
                    }
                    if (targetLength == 0)
                    {
                        DOMError("Corrupted embedded content found", &element);
                    }
                    content = new uint8_t[targetLength];
                    contentLength = static_cast<uint64_t>(targetLength);
                    size_t dst_offset = 0;
                    for (uint32_t tokenIdx = 0; tokenIdx < numTokens; ++tokenIdx)
                    {
                        const Token& dataToken = GetRequiredToken(*Content, tokenIdx);
                        size_t tokenLength = dataToken.end() - dataToken.begin() - 2; // ignore double quotes
                        const char* base64data = dataToken.begin() + 1;
                        dst_offset += Util::DecodeBase64(base64data, tokenLength, content + dst_offset, targetLength - dst_offset);
                    }
                    if (targetLength != dst_offset)
                    {
                        delete[] content;
                        contentLength = 0;
                        DOMError("Corrupted embedded content found", &element);
                    }
                }
            }
            else if (static_cast<size_t>(token.end() - data) < 5) {
                DOMError("binary data array is too short, need five (5) bytes for type signature and element count", &element);
            }
            else if (*data != 'R') {
                DOMWarning("video content is not raw binary data, ignoring", &element);
            }
            else {
                // read number of elements
                uint32_t len = 0;
                ::memcpy(&len, data + 1, sizeof(len));
                AI_SWAP4(len);

                contentLength = len;

                content = new uint8_t[len];
                ::memcpy(content, data + 5, len);
            }
        } catch (const runtime_error& runtimeError)
        {
            //we don't need the content data for contents that has already been loaded
            ASSIMP_LOG_DEBUG_F("Caught exception in FBXMaterial (likely because content was already loaded): ",
                    runtimeError.what());
        }
    }

    props = GetPropertyTable(doc,"Video.FbxVideo",element,sc);
}